

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_dict.cpp
# Opt level: O2

int duckdb_brotli::BrotliFindAllStaticDictionaryMatches
              (BrotliEncoderDictionary *dictionary,uint8_t *data,size_t min_length,size_t max_length
              ,uint32_t *matches)

{
  ContextualEncoderDictionary *pCVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  BrotliEncoderDictionary *dictionary_00;
  uint uVar5;
  uint32_t matches2 [38];
  
  uVar2 = BrotliFindAllStaticDictionaryMatchesFor(dictionary,data,min_length,max_length,matches);
  pCVar1 = dictionary->parent;
  if ((pCVar1 != (ContextualEncoderDictionary *)0x0) && (1 < pCVar1->num_dictionaries)) {
    dictionary_00 = pCVar1->dict[0];
    if (dictionary_00 == dictionary) {
      dictionary_00 = pCVar1->dict[1];
    }
    for (lVar4 = 0; lVar4 != 0x26; lVar4 = lVar4 + 1) {
      matches2[lVar4] = 0xfffffff;
    }
    uVar3 = BrotliFindAllStaticDictionaryMatchesFor
                      (dictionary_00,data,min_length,max_length,matches2);
    for (lVar4 = 0; lVar4 != 0x26; lVar4 = lVar4 + 1) {
      uVar5 = matches2[lVar4];
      if (uVar5 != 0xfffffff) {
        uVar5 = (1 << (dictionary->words->size_bits_by_length[uVar5 & 0x1f] & 0x1f) & 0x7fffffeU) *
                dictionary->num_transforms * 0x20 + uVar5;
        if (matches[lVar4] < uVar5) {
          uVar5 = matches[lVar4];
        }
        matches[lVar4] = uVar5;
      }
    }
    uVar2 = uVar2 | uVar3;
  }
  return uVar2;
}

Assistant:

BROTLI_BOOL duckdb_brotli::BrotliFindAllStaticDictionaryMatches(
    const BrotliEncoderDictionary* dictionary, const uint8_t* data,
    size_t min_length, size_t max_length, uint32_t* matches) {
  BROTLI_BOOL has_found_match =
      BrotliFindAllStaticDictionaryMatchesFor(
          dictionary, data, min_length, max_length, matches);

  if (!!dictionary->parent && dictionary->parent->num_dictionaries > 1) {
    uint32_t matches2[BROTLI_MAX_STATIC_DICTIONARY_MATCH_LEN + 1];
    int l;
    const BrotliEncoderDictionary* dictionary2 = dictionary->parent->dict[0];
    if (dictionary2 == dictionary) {
      dictionary2 = dictionary->parent->dict[1];
    }

    for (l = 0; l < BROTLI_MAX_STATIC_DICTIONARY_MATCH_LEN + 1; l++) {
      matches2[l] = kInvalidMatch;
    }

    has_found_match |= BrotliFindAllStaticDictionaryMatchesFor(
        dictionary2, data, min_length, max_length, matches2);

    for (l = 0; l < BROTLI_MAX_STATIC_DICTIONARY_MATCH_LEN + 1; l++) {
      if (matches2[l] != kInvalidMatch) {
        uint32_t dist = (uint32_t)(matches2[l] >> 5);
        uint32_t len_code = matches2[l] & 31;
        uint32_t skipdist = (uint32_t)((uint32_t)(1 << dictionary->words->
            size_bits_by_length[len_code]) & ~1u) *
            (uint32_t)dictionary->num_transforms;
        /* TODO(lode): check for dist overflow */
        dist += skipdist;
        AddMatch(dist, (size_t)l, len_code, matches);
      }
    }
  }
  return has_found_match;
}